

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void reset_room(ROOM_INDEX_DATA *pRoom)

{
  byte *pbVar1;
  ushort uVar2;
  undefined2 uVar3;
  EXIT_DATA *pEVar4;
  char_data *pcVar5;
  CHAR_DATA *pCVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  OBJ_INDEX_DATA *pOVar12;
  OBJ_INDEX_DATA *pOVar13;
  obj_data *poVar14;
  OBJ_DATA *pOVar15;
  ROOM_INDEX_DATA *pRVar16;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA **ppCVar17;
  char_data *pcVar18;
  ROOM_INDEX_DATA *pRVar19;
  short *args;
  ulong uVar20;
  char *pcVar21;
  long lVar22;
  char_data *pcVar24;
  OBJ_DATA **ppOVar25;
  short sVar26;
  RESET_DATA *pRVar27;
  long lVar28;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  int local_44;
  size_t sVar23;
  
  if (pRoom == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (pRoom->trap != (TRAP_DATA *)0x0) {
    pRoom->trap->armed = true;
  }
  pRVar27 = (RESET_DATA *)&pRoom->reset_first;
  local_44 = 0;
  pcVar18 = (char_data *)0x0;
  bVar8 = true;
LAB_00140594:
  bVar7 = bVar8;
  pcVar24 = pcVar18;
  pRVar27 = pRVar27->next;
  if (pRVar27 == (RESET_DATA *)0x0) {
    return;
  }
  pcVar18 = pcVar24;
  bVar8 = bVar7;
  switch(pRVar27->command) {
  case 'D':
    pRVar16 = get_room_index((int)pRVar27->arg1);
    if (pRVar16 != (ROOM_INDEX_DATA *)0x0) {
      pEVar4 = pRVar16->exit[pRVar27->arg2];
      if (pEVar4 != (EXIT_DATA *)0x0) {
        uVar20 = pEVar4->exit_info[0];
        pEVar4->exit_info[0] = uVar20 | 1;
        sVar26 = pRVar27->arg3;
        if (sVar26 == 2) {
          uVar20 = uVar20 | 7;
        }
        else {
          if (sVar26 != 1) {
            bVar8 = true;
            if (sVar26 == 0) {
              pEVar4->exit_info[0] = uVar20 & 0xfffffffffffffff9 | 1;
              bVar8 = true;
            }
            goto LAB_00140594;
          }
          uVar20 = uVar20 & 0xfffffffffffffff8 | 3;
        }
        pEVar4->exit_info[0] = uVar20;
        bVar8 = true;
      }
      goto LAB_00140594;
    }
    args = &pRVar27->arg1;
    sVar23 = 0x1d;
    pcVar21 = "Reset_area: \'D\': bad vnum {}.";
    break;
  case 'E':
  case 'G':
    args = &pRVar27->arg1;
    pOVar12 = get_obj_index((int)pRVar27->arg1);
    if (pOVar12 == (OBJ_INDEX_DATA *)0x0) {
      sVar23 = 0x24;
      pcVar21 = "Reset_room: \'E\' or \'G\': bad vnum {}.";
      break;
    }
    if (bVar7) {
      if (pcVar24 == (char_data *)0x0) {
        fmt_03._M_str = "Reset_room: \'E\' or \'G\': null mob for vnum {}.";
        fmt_03._M_len = 0x2d;
        CLogger::Warn<short&>((CLogger *)&wear_locations,fmt_03,args);
        pcVar18 = (char_data *)0x0;
        bVar8 = false;
      }
      else if (pcVar24->pIndexData->pShop == (SHOP_DATA *)0x0) {
        if (pOVar12->limcount < pOVar12->limtotal || pOVar12->limtotal < 1) {
          iVar11 = number_fuzzy(local_44);
          if (0x31 < iVar11) {
            iVar11 = 0x32;
          }
          pOVar15 = create_object(pOVar12,iVar11);
          pcVar21 = (char *)palloc_string("none");
          pOVar15->owner = pcVar21;
          goto LAB_00140da2;
        }
      }
      else {
        iVar11 = 0;
        if (pOVar12->new_format != false) goto switchD_00140631_caseD_6;
        iVar11 = 0;
        switch(pOVar12->item_type) {
        case 2:
        case 10:
switchD_00140631_caseD_2:
          iVar11 = 0x35;
          for (lVar28 = 1; lVar28 != 5; lVar28 = lVar28 + 1) {
            if (0 < (long)pOVar12->value[lVar28]) {
              for (lVar22 = 4; lVar22 != 0x10; lVar22 = lVar22 + 1) {
                if (*(short *)(&skill_table + lVar22 * 2 + (long)pOVar12->value[lVar28] * 0x60) <=
                    iVar11) {
                  iVar11 = (int)*(short *)(&skill_table +
                                          lVar22 * 2 + (long)pOVar12->value[lVar28] * 0x60);
                }
              }
            }
          }
          iVar11 = (iVar11 * 3) / 4;
          if (iVar11 < 3) {
            iVar11 = 2;
          }
          iVar11 = iVar11 + -2;
          break;
        case 3:
        case 8:
          iVar11 = 10;
          iVar10 = 0x14;
          goto LAB_00140d6a;
        case 4:
          iVar11 = 0xf;
          iVar10 = 0x19;
          goto LAB_00140d6a;
        case 5:
        case 9:
          iVar11 = 5;
          iVar10 = 0xf;
LAB_00140d6a:
          iVar11 = number_range(iVar11,iVar10);
          break;
        case 6:
        case 7:
          break;
        default:
          if (pOVar12->item_type == 0x1a) goto switchD_00140631_caseD_2;
        }
switchD_00140631_caseD_6:
        pOVar15 = create_object(pOVar12,iVar11);
        pcVar21 = (char *)palloc_string("none");
        pOVar15->owner = pcVar21;
        if (pOVar15->pIndexData->limtotal == 0) {
          pbVar1 = (byte *)((long)pOVar15->extra_flags + 1);
          *pbVar1 = *pbVar1 | 0x20;
        }
LAB_00140da2:
        obj_to_char(pOVar15,pcVar24);
        bVar8 = true;
        if (pRVar27->command == 'E') {
          sVar26 = pRVar27->arg3;
          if (sVar26 == 0x12) {
            iVar11 = 0x10;
            lVar28 = get_eq_char(pcVar24,0x10);
            if (lVar28 != 0) goto LAB_00140e2f;
          }
          else {
            if (sVar26 == 0x10) {
              poVar14 = (obj_data *)get_eq_char(pcVar24,0x10);
              if (poVar14 != (obj_data *)0x0) {
                unequip_char(pcVar24,poVar14,true);
                equip_char(pcVar24,poVar14,0x12,true);
                equip_char(pcVar24,pOVar15,0x10,true);
LAB_00140e13:
                bVar8 = true;
                goto LAB_00140594;
              }
LAB_00140e2f:
              sVar26 = pRVar27->arg3;
            }
            iVar11 = (int)sVar26;
          }
          equip_char(pcVar24,pOVar15,iVar11,true);
          bVar8 = true;
        }
      }
    }
    goto LAB_00140594;
  case 'F':
    pcVar18 = (char_data *)0x0;
    if (pcVar24 != (char_data *)0x0) {
      ppCVar17 = &pcVar24->in_room->people;
      while (pcVar5 = *ppCVar17, pcVar18 = pcVar24, pcVar5 != (char_data *)0x0) {
        cVar9 = is_npc(pcVar5);
        if ((cVar9 != '\0') && (pRVar27->arg2 == pcVar5->pIndexData->vnum)) {
          if (bVar7) {
            add_follower(pcVar24,pcVar5);
            pcVar24->leader = pcVar5;
          }
          break;
        }
        ppCVar17 = &pcVar5->next_in_room;
      }
    }
    goto LAB_00140594;
  default:
    fmt._M_str = "Reset_area: bad command {}.";
    fmt._M_len = 0x1b;
    CLogger::Warn<char&>((CLogger *)&wear_locations,fmt,&pRVar27->command);
    goto LAB_00140594;
  case 'M':
    pMobIndex = get_mob_index((int)pRVar27->arg1);
    if (pMobIndex == (MOB_INDEX_DATA *)0x0) {
      args = &pRVar27->arg1;
      sVar23 = 0x1d;
      pcVar21 = "Reset_area: \'M\': bad vnum {}.";
    }
    else {
      pRVar16 = get_room_index((int)pRVar27->arg3);
      if (pRVar16 != (ROOM_INDEX_DATA *)0x0) {
        iVar11 = 0;
        bVar8 = false;
        if (pMobIndex->count < pRVar27->arg2) {
          ppCVar17 = &pRVar16->people;
          while (pCVar6 = *ppCVar17, pCVar6 != (CHAR_DATA *)0x0) {
            if (pCVar6->pIndexData == pMobIndex) {
              iVar11 = iVar11 + 1;
              iVar10 = (int)pRVar27->arg4;
              if (iVar10 <= iVar11) {
                bVar7 = false;
                goto LAB_00140c54;
              }
            }
            ppCVar17 = &pCVar6->next_in_room;
          }
          iVar10 = (int)pRVar27->arg4;
LAB_00140c54:
          bVar8 = bVar7;
          if (iVar11 < iVar10) {
            pcVar18 = create_mobile(pMobIndex);
            cVar9 = room_is_dark(pRoom);
            if (cVar9 != '\0') {
              pbVar1 = (byte *)((long)pcVar18->affected_by + 1);
              *pbVar1 = *pbVar1 | 2;
            }
            pRVar19 = get_room_index(pRoom->vnum + -1);
            if ((pRVar19 != (ROOM_INDEX_DATA *)0x0) && ((pRVar19->room_flags[0] & 0x1000) != 0)) {
              pbVar1 = (byte *)((long)pcVar18->act + 1);
              *pbVar1 = *pbVar1 | 1;
            }
            pcVar18->zone = pRVar16->area;
            char_to_room(pcVar18,pRoom);
            uVar2 = pcVar18->level;
            local_44 = 0;
            bVar8 = true;
            if (1 < (short)uVar2) {
              local_44 = (short)uVar2 + -2;
              if (0x34 < uVar2) {
                local_44 = 0x32;
              }
              bVar8 = true;
            }
          }
        }
        goto LAB_00140594;
      }
      args = &pRVar27->arg3;
      sVar23 = 0x1d;
      pcVar21 = "Reset_area: \'R\': bad vnum {}.";
    }
    break;
  case 'O':
    pOVar12 = get_obj_index((int)pRVar27->arg1);
    if (pOVar12 == (OBJ_INDEX_DATA *)0x0) {
      fmt_00._M_str = "Reset_room: \'O\' 1 : bad vnum {}";
      fmt_00._M_len = 0x1f;
      CLogger::Warn<short&>((CLogger *)&wear_locations,fmt_00,&pRVar27->arg1);
LAB_00140b5e:
      fmt_02._M_str = "{} {} {} {}";
      fmt_02._M_len = 0xb;
      CLogger::Warn<short&,short&,short&,short&>
                ((CLogger *)&wear_locations,fmt_02,&pRVar27->arg1,&pRVar27->arg2,&pRVar27->arg3,
                 &pRVar27->arg4);
    }
    else {
      pRVar16 = get_room_index((int)pRVar27->arg3);
      if (pRVar16 == (ROOM_INDEX_DATA *)0x0) {
        fmt_01._M_str = "Reset_room: \'O\' 2 : bad vnum {}.";
        fmt_01._M_len = 0x20;
        CLogger::Warn<short&>((CLogger *)&wear_locations,fmt_01,&pRVar27->arg3);
        goto LAB_00140b5e;
      }
      ppOVar25 = &pRVar16->contents;
      while (poVar14 = *ppOVar25, poVar14 != (obj_data *)0x0) {
        if (((((poVar14->pIndexData->vnum == pOVar12->vnum) &&
              (cVar9 = is_obj_stat(poVar14,0x21), cVar9 == '\0')) &&
             (cVar9 = is_obj_stat(poVar14,0x18), cVar9 == '\0')) &&
            ((cVar9 = is_obj_stat(poVar14,0x17), cVar9 == '\0' && (poVar14->item_type == 0xf)))) &&
           (poVar14->contains == (OBJ_DATA *)0x0)) {
          extract_obj(poVar14);
        }
        ppOVar25 = &poVar14->next_content;
      }
      bVar8 = false;
      if (pOVar12->limcount < pOVar12->limtotal || pOVar12->limtotal < 1) {
        iVar11 = count_obj_list(pOVar12,pRVar16->contents);
        bVar8 = false;
        if (iVar11 < 1) {
          iVar11 = number_fuzzy(local_44);
          if (0x31 < iVar11) {
            iVar11 = 0x32;
          }
          pOVar15 = create_object(pOVar12,iVar11);
          pOVar15->cost = 0;
          pcVar21 = (char *)palloc_string("none");
          pOVar15->owner = pcVar21;
          pcVar21 = (char *)palloc_string("someone a long long time ago");
          pOVar15->talked = pcVar21;
          obj_to_room(pOVar15,pRoom);
          goto LAB_00140e13;
        }
      }
    }
    goto LAB_00140594;
  case 'P':
    pOVar12 = get_obj_index((int)pRVar27->arg1);
    if (pOVar12 == (OBJ_INDEX_DATA *)0x0) {
      args = &pRVar27->arg1;
    }
    else {
      pOVar13 = get_obj_index((int)pRVar27->arg3);
      if (pOVar13 != (OBJ_INDEX_DATA *)0x0) {
        uVar3 = pRVar27->arg2;
        sVar26 = uVar3;
        if (uVar3 == -1) {
          sVar26 = 999;
        }
        if (0x32 < (short)uVar3) {
          sVar26 = 6;
        }
        bVar8 = false;
        if (pRoom->area->nplayer < 2) {
          poVar14 = (obj_data *)get_obj_type(pOVar13);
          bVar8 = false;
          if ((((poVar14 != (obj_data *)0x0) &&
               ((poVar14->in_room != (ROOM_INDEX_DATA *)0x0 || (bVar8 = false, bVar7)))) &&
              ((pOVar12->limtotal < 1 || (bVar8 = false, pOVar12->limcount < pOVar12->limtotal))))
             && (bVar8 = false, pOVar12->count < sVar26)) {
            iVar11 = count_obj_list(pOVar12,poVar14->contains);
            bVar8 = false;
            if (iVar11 <= pRVar27->arg4) {
              iVar11 = iVar11 + -1;
              do {
                iVar11 = iVar11 + 1;
                if (pRVar27->arg4 <= iVar11) break;
                iVar10 = number_fuzzy((int)poVar14->level);
                pOVar15 = create_object(pOVar12,iVar10);
                pcVar21 = (char *)palloc_string("none");
                pOVar15->owner = pcVar21;
                obj_to_obj(pOVar15,poVar14);
              } while (pOVar12->limtotal < 1 || pOVar12->limcount < pOVar12->limtotal);
              poVar14->value[1] = poVar14->pIndexData->value[1];
              bVar8 = true;
            }
          }
        }
        goto LAB_00140594;
      }
      args = &pRVar27->arg3;
    }
    sVar23 = 0x1d;
    pcVar21 = "Reset_room: \'P\': bad vnum {}.";
    break;
  case 'R':
    pRVar16 = get_room_index((int)pRVar27->arg1);
    if (pRVar16 == (ROOM_INDEX_DATA *)0x0) {
      args = &pRVar27->arg1;
      sVar23 = 0x1d;
      pcVar21 = "Reset_room: \'R\': bad vnum {}.";
      break;
    }
    for (lVar28 = 0; lVar22 = (long)pRVar27->arg2 + -1, lVar28 < lVar22; lVar28 = lVar28 + 1) {
      iVar11 = number_range((int)lVar28,(int)lVar22);
      pEVar4 = pRVar16->exit[lVar28];
      pRVar16->exit[lVar28] = pRVar16->exit[iVar11];
      pRVar16->exit[iVar11] = pEVar4;
    }
    goto LAB_00140594;
  }
  fmt_04._M_str = pcVar21;
  fmt_04._M_len = sVar23;
  CLogger::Warn<short&>((CLogger *)&wear_locations,fmt_04,args);
  goto LAB_00140594;
}

Assistant:

void reset_room(ROOM_INDEX_DATA *pRoom)
{
	RESET_DATA *pReset;
	CHAR_DATA *pMob;
	CHAR_DATA *mob;
	OBJ_DATA *pObj, *pObj2;
	CHAR_DATA *LastMob = nullptr;
	OBJ_DATA *LastObj = nullptr;
	EXIT_DATA *pexit = nullptr;
	bool last;
	int level = 0;
	char buf[MSL];
	CHAR_DATA *rch;
	bool found;

	if (!pRoom)
		return;

	pMob = nullptr;
	last = true;

	if (pRoom->trap)
		pRoom->trap->armed = true;

	for (pReset = pRoom->reset_first; pReset != nullptr; pReset = pReset->next)
	{
		ROOM_INDEX_DATA *pRoomIndex = nullptr;
		MOB_INDEX_DATA *pMobIndex = nullptr;
		OBJ_INDEX_DATA *pObjIndex = nullptr;
		OBJ_INDEX_DATA *pObjToIndex = nullptr;
		OBJ_DATA *secondary = nullptr;
		int count, limit;

		switch (pReset->command)
		{
			case 'M':
				pMobIndex = get_mob_index(pReset->arg1);

				if (pMobIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'M': bad vnum {}.", pReset->arg1);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'R': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pMobIndex->count >= pReset->arg2)
				{
					last= false;
					break;
				}

				count = 0;
				for (mob = pRoomIndex->people; mob != nullptr; mob = mob->next_in_room)
				{
					if (mob->pIndexData == pMobIndex)
					{
						count++;
						if (count >= pReset->arg4)
						{
							last= false;
							break;
						}
					}
				}

				if (count >= pReset->arg4)
					break;

				pMob = create_mobile(pMobIndex);

				/*
				* Some more hard coding.
				*/
				if (room_is_dark(pRoom))
					SET_BIT(pMob->affected_by, AFF_INFRARED);

				/*
				* Pet shop mobiles get ACT_PET set.
				*/
				{
					ROOM_INDEX_DATA *pRoomIndexPrev;

					pRoomIndexPrev = get_room_index(pRoom->vnum - 1);
					if (pRoomIndexPrev && IS_SET(pRoomIndexPrev->room_flags, ROOM_PET_SHOP))
						SET_BIT(pMob->act, ACT_PET);
				}

				pMob->zone = pRoomIndex->area;

				char_to_room(pMob, pRoom);

				LastMob = pMob;
				level = URANGE(0, pMob->level - 2, LEVEL_HERO - 1); /* -1 ROM */
				last = true;
				break;
			case 'O':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 1 : bad vnum {}", pReset->arg1);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 2 : bad vnum {}.", pReset->arg3);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				for (pObj2 = pRoomIndex->contents; pObj2; pObj2 = pObj2->next_content)
				{
					if (pObj2->pIndexData->vnum == pObjIndex->vnum
						&& !is_obj_stat(pObj2, ITEM_DONATION_PIT)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_PC)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_NPC)
						&& pObj2->item_type == ITEM_CONTAINER
						&& !pObj2->contains)
					{
						extract_obj(pObj2);
					}
				}

				if ((pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					|| count_obj_list(pObjIndex, pRoomIndex->contents) > 0)
				{
					last= false;
					break;
				}

				pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
				pObj->cost = 0;
				pObj->owner = palloc_string("none");
				pObj->talked = palloc_string("someone a long long time ago");

				obj_to_room(pObj, pRoom);

				last = true;
				break;
			case 'P':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg1);
					continue;
				}

				pObjToIndex = get_obj_index(pReset->arg3);

				if (!pObjToIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pReset->arg2 > 50)
					limit = 6;
				else if (pReset->arg2 == -1)
					limit = 999;
				else
					limit = pReset->arg2;

				if (pRoom->area->nplayer > 1
					|| (LastObj = get_obj_type(pObjToIndex)) == nullptr
					|| (LastObj->in_room == nullptr && !last)
					|| (pObjIndex->limtotal > 0 && pObjIndex->limcount >= pObjIndex->limtotal)
					|| (pObjIndex->count >= limit /* && number_range(0,4) != 0 */)
					|| (count = count_obj_list(pObjIndex, LastObj->contains)) > pReset->arg4)
				{
					last= false;
					break;
				}

				while (count < pReset->arg4)
				{
					pObj = create_object(pObjIndex, number_fuzzy(LastObj->level));
					pObj->owner = palloc_string("none");
					obj_to_obj(pObj, LastObj);

					count++;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
						break;
				}

				LastObj->value[1] = LastObj->pIndexData->value[1];
				last = true;
				break;
			case 'G':
			case 'E':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': bad vnum {}.", pReset->arg1);
					continue;
				}

				if (!last)
					break;

				if (!LastMob)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': null mob for vnum {}.", pReset->arg1);
					last= false;
					break;
				}

				if (LastMob->pIndexData->pShop)
				{
					int olevel = 0, i, j;

					if (!pObjIndex->new_format)
					{
						switch (pObjIndex->item_type)
						{
							case ITEM_PILL:
							case ITEM_POTION:
							case ITEM_SCROLL:
								olevel = 53;
								for (i = 1; i < 5; i++)
								{
									if (pObjIndex->value[i] > 0)
									{
										for (j = 0; j < MAX_CLASS; j++)
										{
											olevel = std::min(olevel, (int)skill_table[pObjIndex->value[i]].skill_level[j]);
										}
									}
								}
								olevel = std::max(0, (olevel * 3 / 4) - 2);
								break;
							case ITEM_WAND:
								olevel = number_range(10, 20);
								break;
							case ITEM_STAFF:
								olevel = number_range(15, 25);
								break;
							case ITEM_ARMOR:
								olevel = number_range(5, 15);
								break;
							case ITEM_WEAPON:
								olevel = number_range(5, 15);
								break;
							case ITEM_TREASURE:
								olevel = number_range(10, 20);
								break;
							default:
								olevel = 0;
								break;
						}
					}

					pObj = create_object(pObjIndex, olevel);
					pObj->owner = palloc_string("none");

					if (pObj->pIndexData->limtotal == 0)
						SET_BIT(pObj->extra_flags, ITEM_INVENTORY);
				}
				else /* ROM OLC else version */
				{
					int limit;

					if (pReset->arg2 > 50) /* old format */
						limit = 6;
					else if (pReset->arg2 == -1 || pReset->arg2 == 0) /* no limit */
						limit = 999;
					else
						limit = pReset->arg2;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					{
						break;
					}
					else
					{
						pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
					}

					pObj->owner = palloc_string("none");
				}

				obj_to_char(pObj, LastMob);

				if (pReset->command == 'E')
				{
					if (pReset->arg3 == 16)
					{
						secondary = get_eq_char(LastMob, WEAR_WIELD);

						if (secondary != nullptr)
						{
							unequip_char(LastMob, secondary, true);
							equip_char(LastMob, secondary, 18, true);
							equip_char(LastMob, pObj, 16, true);
						}
						else
						{
							equip_char(LastMob, pObj, pReset->arg3, true);
						}
					}
					else if (pReset->arg3 == 18)
					{
						if (get_eq_char(LastMob, WEAR_WIELD) == nullptr)
							equip_char(LastMob, pObj, 16, true);
						else
							equip_char(LastMob, pObj, pReset->arg3, true);
					}
					else
					{
						equip_char(LastMob, pObj, pReset->arg3, true);
					}
				}
				last = true;
				break;

			case 'F':
				found= false;

				if (!LastMob)
					continue;

				for (rch = LastMob->in_room->people; rch != nullptr; rch = rch->next_in_room)
				{
					if (is_npc(rch) && (pReset->arg2 == rch->pIndexData->vnum))
					{
						found = true;
						break;
					}
				}

				if (!last || !found)
					break;

				add_follower(LastMob, rch);
				LastMob->leader = rch;
				break;
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'D': bad vnum {}.", pReset->arg1);
					continue;
				}

				pexit = pRoomIndex->exit[pReset->arg2];

				if (pexit == nullptr)
					break;

				SET_BIT(pexit->exit_info, EX_ISDOOR);

				switch (pReset->arg3)
				{
					case 0:
						REMOVE_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 1:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 2:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						SET_BIT(pexit->exit_info, EX_LOCKED);
						break;
				}

				last = true;
				break;
			case 'R':
				pRoomIndex = get_room_index(pReset->arg1);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'R': bad vnum {}.", pReset->arg1);
					continue;
				}

				{
					EXIT_DATA *pExit;
					int d0;
					int d1;

					for (d0 = 0; d0 < pReset->arg2 - 1; d0++)
					{
						d1 = number_range(d0, pReset->arg2 - 1);
						pExit = pRoomIndex->exit[d0];
						pRoomIndex->exit[d0] = pRoomIndex->exit[d1];
						pRoomIndex->exit[d1] = pExit;
					}
				}

				break;
			default:
				RS.Logger.Warn("Reset_area: bad command {}.", pReset->command);
				break;
		}
	}
}